

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O1

void encode_block_intra_and_set_context
               (int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,TX_SIZE tx_size,
               void *arg)

{
  MACROBLOCKD *xd;
  CommonQuantParams *quant_params;
  int iVar1;
  int iVar2;
  int iVar3;
  MACROBLOCK *x;
  uint16_t *puVar4;
  MB_MODE_INFO *pMVar5;
  BLOCK_SIZE plane_bsize_00;
  long lVar6;
  byte *pbVar7;
  TX_TYPE tx_type;
  uint uVar8;
  char cVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  void *__s;
  bool bVar16;
  int dummy_rate_cost;
  long local_d0;
  long local_c8;
  ulong local_c0;
  long local_b8;
  ENTROPY_CONTEXT *local_b0;
  ENTROPY_CONTEXT *local_a8;
  CommonQuantParams *local_a0;
  tran_low_t *local_98;
  uint8_t *local_90;
  ulong local_88;
  MB_MODE_INFO *local_80;
  TXB_CTX txb_ctx;
  TxfmParam txfm_param;
  QUANT_PARAM quant_param;
  
  lVar10 = *arg;
  x = *(MACROBLOCK **)((long)arg + 8);
  local_80 = *(x->e_mbd).mi;
  lVar15 = (long)plane;
  uVar8 = (x->e_mbd).plane[lVar15].dst.stride;
  local_88 = (ulong)uVar8;
  local_90 = (x->e_mbd).plane[lVar15].dst.buf + (int)((uVar8 * blk_row + blk_col) * 4);
  local_c8 = lVar15 * 0x88;
  local_98 = x->plane[lVar15].dqcoeff + (block << 4);
  puVar4 = x->plane[lVar15].eobs;
  dummy_rate_cost = 0;
  xd = &x->e_mbd;
  local_d0 = (long)block;
  av1_predict_intra_block_facade((AV1_COMMON *)(lVar10 + 0x3bf80),xd,plane,blk_col,blk_row,tx_size);
  local_c0 = (ulong)plane_bsize;
  uVar13 = (ulong)tx_size;
  lVar15 = (long)blk_col;
  lVar14 = (long)blk_row;
  local_b8 = lVar14;
  if ((plane == 0) &&
     (((x->txfm_search_info).blk_skip
       [(int)((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [local_c0] * blk_row + blk_col)] & 1) != 0)) {
    puVar4[local_d0] = 0;
    *(undefined1 *)(*(long *)((long)&x->plane[0].txb_entropy_ctx + local_c8) + local_d0) = 0;
    tx_type = '\0';
  }
  else {
    av1_subtract_txb(x,plane,plane_bsize,blk_col,blk_row,tx_size);
    pMVar5 = *(x->e_mbd).mi;
    if ((x->e_mbd).lossless[*(ushort *)&pMVar5->field_0xa7 & 7] == 0) {
      if ((0x61810UL >> (uVar13 & 0x3f) & 1) == 0) {
        if (plane == 0) {
          uVar8 = (uint)(x->e_mbd).tx_type_map[(x->e_mbd).tx_type_map_stride * blk_row + blk_col];
        }
        else {
          cVar9 = (char)*(ushort *)&pMVar5->field_0xa7;
          if ((cVar9 < '\0') || ('\0' < pMVar5->ref_frame[0])) {
            pbVar7 = (x->e_mbd).tx_type_map +
                     ((blk_row << ((byte)(x->e_mbd).plane[1].subsampling_y & 0x1f)) *
                      (x->e_mbd).tx_type_map_stride +
                     (blk_col << ((byte)(x->e_mbd).plane[1].subsampling_x & 0x1f)));
          }
          else {
            pbVar7 = intra_mode_to_tx_type__intra_mode_to_tx_type +
                     (byte)get_uv_mode_uv2y[pMVar5->uv_mode];
          }
          uVar8 = 1;
          if (-1 < cVar9) {
            uVar8 = (uint)('\0' < pMVar5->ref_frame[0]);
          }
          if ((0x18608UL >> (uVar13 & 0x3f) & 1) == 0) {
            if (*(char *)(lVar10 + 0x3c175) == '\0') {
              uVar8 = (uint)av1_ext_tx_set_lookup[0]
                            [(ulong)((0x60604UL >> (uVar13 & 0x3f) & 1) != 0) + (ulong)(uVar8 * 2)];
            }
            else {
              uVar8 = (uint)(byte)((uVar8 == 0) + 1);
            }
          }
          uVar8 = *(uint *)((long)av1_ext_tx_used[0] + (ulong)*pbVar7 * 4 + (ulong)(uVar8 << 6));
          if (uVar8 != 0) {
            uVar8 = (uint)*pbVar7;
          }
        }
      }
      else {
        uVar8 = 0;
      }
    }
    else {
      uVar8 = 0;
    }
    local_a8 = (ENTROPY_CONTEXT *)(*(long *)((long)arg + 0x18) + lVar15);
    local_b0 = (ENTROPY_CONTEXT *)(*(long *)((long)arg + 0x20) + lVar14);
    cVar9 = *(char *)((long)arg + 0x29);
    bVar16 = *(char *)((long)arg + 0x28) == '\0';
    tx_type = (TX_TYPE)uVar8;
    av1_setup_xform((AV1_COMMON *)(lVar10 + 0x3bf80),x,tx_size,tx_type,&txfm_param);
    iVar1 = *(int *)(lVar10 + 0x423fc);
    quant_param.log_scale = av1_get_tx_scale(tx_size);
    quant_param.xform_quant_idx = (int)(!bVar16 && cVar9 == '\x02' || cVar9 == '\0');
    quant_param.qmatrix = (qm_val_t *)0x0;
    quant_param.iqmatrix = (qm_val_t *)0x0;
    quant_params = (CommonQuantParams *)(lVar10 + 0x3c1e8);
    quant_param.tx_size = tx_size;
    quant_param.use_quant_b_adapt = iVar1;
    quant_param.use_optimize_b = (uint)((bVar16 || cVar9 != '\x02') && cVar9 != '\0');
    quant_param.qmatrix = av1_get_qmatrix(quant_params,xd,plane,tx_size,tx_type);
    local_a0 = quant_params;
    quant_param.iqmatrix = av1_get_iqmatrix(quant_params,xd,plane,tx_size,tx_type);
    plane_bsize_00 = (BLOCK_SIZE)local_c0;
    av1_xform_quant(x,plane,block,blk_row,blk_col,plane_bsize_00,&txfm_param,&quant_param);
    if (quant_param.use_optimize_b != 0) {
      get_txb_ctx(plane_bsize_00,tx_size,plane,local_a8,local_b0,&txb_ctx);
      av1_optimize_b(*arg,x,plane,block,tx_size,tx_type,&txb_ctx,&dummy_rate_cost);
    }
    av1_dropout_qcoeff(x,plane,block,tx_size,tx_type,local_a0->base_qindex);
  }
  lVar6 = local_c8;
  lVar14 = local_d0;
  if (puVar4[local_d0] != 0) {
    av1_inverse_transform_block
              (xd,local_98,plane,tx_type,tx_size,local_90,(int)local_88,(uint)puVar4[local_d0],
               (uint)*(byte *)(lVar10 + 0x3c175));
  }
  if ((plane == 0) && (puVar4[lVar14] == 0)) {
    iVar1 = (x->e_mbd).tx_type_map_stride;
    (x->e_mbd).tx_type_map[iVar1 * blk_row + blk_col] = '\0';
    iVar2 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
    iVar3 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
    if (((0x41010UL >> (uVar13 & 0x3f) & 1) != 0) || ((0x20810UL >> (uVar13 & 0x3f) & 1) != 0)) {
      lVar10 = iVar1 * local_b8 + lVar15;
      lVar11 = 0;
      do {
        lVar12 = 0;
        do {
          (x->e_mbd).tx_type_map[lVar12 + lVar10] = '\0';
          lVar12 = lVar12 + 4;
        } while (lVar12 < iVar2);
        lVar11 = lVar11 + 4;
        lVar10 = lVar10 + (long)iVar1 * 4;
      } while (lVar11 < iVar3);
    }
  }
  local_80->skip_txfm = '\0';
  if ((plane == 0) && ((x->e_mbd).cfl.store_y != 0)) {
    cfl_store_tx(xd,blk_row,blk_col,tx_size,(BLOCK_SIZE)local_c0);
  }
  __s = (void *)(local_b8 + *(long *)((long)arg + 0x20));
  uVar8 = (uint)*(byte *)(*(long *)(*(long *)((long)arg + 8) + 0x28 + lVar6) + lVar14);
  memset((void *)(lVar15 + *(long *)((long)arg + 0x18)),uVar8,(long)tx_size_wide_unit[tx_size]);
  memset(__s,uVar8,(long)tx_size_high_unit[tx_size]);
  return;
}

Assistant:

static void encode_block_intra_and_set_context(int plane, int block,
                                               int blk_row, int blk_col,
                                               BLOCK_SIZE plane_bsize,
                                               TX_SIZE tx_size, void *arg) {
  encode_block_intra(plane, block, blk_row, blk_col, plane_bsize, tx_size, arg);

  struct encode_b_args *const args = arg;
  MACROBLOCK *x = args->x;
  ENTROPY_CONTEXT *a = &args->ta[blk_col];
  ENTROPY_CONTEXT *l = &args->tl[blk_row];
  av1_set_txb_context(x, plane, block, tx_size, a, l);
}